

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O0

void tt_prepare_zone(TT_GlyphZone zone,FT_GlyphLoad load,FT_UInt start_point,FT_UInt start_contour)

{
  FT_UInt start_contour_local;
  FT_UInt start_point_local;
  FT_GlyphLoad load_local;
  TT_GlyphZone zone_local;
  
  zone->n_points = (load->outline).n_points - (FT_UShort)start_point;
  zone->n_contours = (load->outline).n_contours - (short)start_contour;
  zone->org = load->extra_points + start_point;
  zone->cur = (load->outline).points + start_point;
  zone->orus = load->extra_points2 + start_point;
  zone->tags = (FT_Byte *)((load->outline).tags + start_point);
  zone->contours = (FT_UShort *)((load->outline).contours + start_contour);
  zone->first_point = (FT_UShort)start_point;
  return;
}

Assistant:

static void
  tt_prepare_zone( TT_GlyphZone  zone,
                   FT_GlyphLoad  load,
                   FT_UInt       start_point,
                   FT_UInt       start_contour )
  {
    zone->n_points    = (FT_UShort)load->outline.n_points -
                          (FT_UShort)start_point;
    zone->n_contours  = load->outline.n_contours -
                          (FT_Short)start_contour;
    zone->org         = load->extra_points + start_point;
    zone->cur         = load->outline.points + start_point;
    zone->orus        = load->extra_points2 + start_point;
    zone->tags        = (FT_Byte*)load->outline.tags + start_point;
    zone->contours    = (FT_UShort*)load->outline.contours + start_contour;
    zone->first_point = (FT_UShort)start_point;
  }